

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void run_timer_loop_once(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  undefined8 uStack_b0;
  uv_timer_t timer_handle;
  
  loop = uv_default_loop();
  timer_cb_called = 0;
  iVar1 = uv_timer_init(loop,&timer_handle);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&timer_handle,timer_cb,1,0);
    if (iVar1 == 0) {
      iVar1 = uv_run(loop,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        if (timer_cb_called == 1) {
          return;
        }
        pcVar2 = "1 == timer_cb_called";
        uStack_b0 = 0x48;
      }
      else {
        pcVar2 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
        uStack_b0 = 0x47;
      }
    }
    else {
      pcVar2 = "0 == uv_timer_start(&timer_handle, timer_cb, 1, 0)";
      uStack_b0 = 0x46;
    }
  }
  else {
    pcVar2 = "0 == uv_timer_init(loop, &timer_handle)";
    uStack_b0 = 0x45;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c",
          uStack_b0,pcVar2);
  abort();
}

Assistant:

static void run_timer_loop_once(void) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();

  timer_cb_called = 0; /* Reset for the child. */

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
}